

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSTimeDepartureEdct.c
# Opt level: O0

void FANSTimeDepartureEdct_1_inherit_TYPE_descriptor(asn_TYPE_descriptor_t *td)

{
  asn_TYPE_descriptor_t *td_local;
  
  td->free_struct = asn_DEF_FANSTime.free_struct;
  td->print_struct = asn_DEF_FANSTime.print_struct;
  td->check_constraints = asn_DEF_FANSTime.check_constraints;
  td->ber_decoder = asn_DEF_FANSTime.ber_decoder;
  td->der_encoder = asn_DEF_FANSTime.der_encoder;
  td->xer_decoder = asn_DEF_FANSTime.xer_decoder;
  td->xer_encoder = asn_DEF_FANSTime.xer_encoder;
  td->uper_decoder = asn_DEF_FANSTime.uper_decoder;
  td->uper_encoder = asn_DEF_FANSTime.uper_encoder;
  if (td->per_constraints == (asn_per_constraints_t *)0x0) {
    td->per_constraints = asn_DEF_FANSTime.per_constraints;
  }
  td->elements = asn_DEF_FANSTime.elements;
  td->elements_count = asn_DEF_FANSTime.elements_count;
  td->specifics = asn_DEF_FANSTime.specifics;
  return;
}

Assistant:

static void
FANSTimeDepartureEdct_1_inherit_TYPE_descriptor(asn_TYPE_descriptor_t *td) {
	td->free_struct    = asn_DEF_FANSTime.free_struct;
	td->print_struct   = asn_DEF_FANSTime.print_struct;
	td->check_constraints = asn_DEF_FANSTime.check_constraints;
	td->ber_decoder    = asn_DEF_FANSTime.ber_decoder;
	td->der_encoder    = asn_DEF_FANSTime.der_encoder;
	td->xer_decoder    = asn_DEF_FANSTime.xer_decoder;
	td->xer_encoder    = asn_DEF_FANSTime.xer_encoder;
	td->uper_decoder   = asn_DEF_FANSTime.uper_decoder;
	td->uper_encoder   = asn_DEF_FANSTime.uper_encoder;
	if(!td->per_constraints)
		td->per_constraints = asn_DEF_FANSTime.per_constraints;
	td->elements       = asn_DEF_FANSTime.elements;
	td->elements_count = asn_DEF_FANSTime.elements_count;
	td->specifics      = asn_DEF_FANSTime.specifics;
}